

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int __thiscall
array<CLayer_*,_allocator_default<CLayer_*>_>::remove
          (array<CLayer_*,_allocator_default<CLayer_*>_> *this,char *__filename)

{
  int iVar1;
  ulong uVar2;
  ulong extraout_RAX;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  uint local_1c;
  undefined1 local_1;
  
  local_1c = 0;
  do {
    uVar3 = local_1c;
    iVar1 = size(this);
    uVar2 = (ulong)uVar3;
    if (iVar1 <= (int)uVar3) {
      local_1 = 0;
LAB_002183f4:
      return (int)CONCAT71((int7)(uVar2 >> 8),local_1);
    }
    if (this->list[(int)local_1c] == *(CLayer **)__filename) {
      remove_index((array<CLayer_*,_allocator_default<CLayer_*>_> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
      local_1 = 1;
      uVar2 = extraout_RAX;
      goto LAB_002183f4;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}